

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall QConfFileSettingsPrivate::sync(QConfFileSettingsPrivate *this)

{
  bool bVar1;
  const_iterator o;
  long in_FS_OFFSET;
  QConfFile *confFile;
  add_const_t<QList<QConfFile_*>_> *__range1;
  scoped_lock<QMutex> locker;
  const_iterator __end1;
  const_iterator __begin1;
  QConfFile *in_stack_00000118;
  QConfFileSettingsPrivate *in_stack_00000120;
  QMutex *in_stack_ffffffffffffff98;
  QList<QConfFile_*> *in_stack_ffffffffffffffa0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QConfFile **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QConfFile_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<QConfFile_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = QList<QConfFile_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QConfFile_*>::const_iterator::operator*(&local_10);
    (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>
              (in_stack_ffffffffffffff98);
    syncConfFile(in_stack_00000120,in_stack_00000118);
    std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x7ae9d3);
    QList<QConfFile_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConfFileSettingsPrivate::sync()
{
    // people probably won't be checking the status a whole lot, so in case of
    // error we just try to go on and make the best of it

    for (auto confFile : std::as_const(confFiles)) {
        const auto locker = qt_scoped_lock(confFile->mutex);
        syncConfFile(confFile);
    }
}